

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTable.cpp
# Opt level: O0

void __thiscall KeyWordTable::KeyWordTable(KeyWordTable *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  reference pbVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c0;
  undefined1 local_558 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> c;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  allocator local_518;
  allocator local_517;
  allocator local_516;
  allocator local_515;
  allocator local_514;
  allocator local_513;
  allocator local_512;
  allocator local_511;
  allocator local_510;
  allocator local_50f;
  allocator local_50e;
  allocator local_50d;
  allocator local_50c;
  allocator local_50b;
  allocator local_50a;
  allocator local_509;
  allocator local_508;
  allocator local_507;
  allocator local_506;
  allocator local_505;
  allocator local_504;
  allocator local_503;
  allocator local_502;
  allocator local_501;
  allocator local_500;
  allocator local_4ff;
  allocator local_4fe;
  allocator local_4fd;
  allocator local_4fc;
  allocator local_4fb;
  allocator local_4fa;
  allocator local_4f9;
  allocator local_4f8;
  allocator local_4f7;
  allocator local_4f6;
  allocator local_4f5 [20];
  allocator local_4e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8 [32];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keyWord;
  KeyWordTable *this_local;
  
  keyWord.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Table
            (&this->
              super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  __range1._7_1_ = 1;
  local_4e0 = &local_4d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d8,"auto",&local_4e1);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"short",local_4f5);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"int",&local_4f6);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"long",&local_4f7);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_458,"real",&local_4f8);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"double",&local_4f9);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"char",&local_4fa);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"struct",&local_4fb);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"union",&local_4fc);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"enum",&local_4fd);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"typedef",&local_4fe);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"const",&local_4ff);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"unsigned",&local_500);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"signed",&local_501);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"extern",&local_502);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"register",&local_503);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"static",&local_504);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"volatile",&local_505);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"void",&local_506);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"if",&local_507);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"else",&local_508);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,"switch",&local_509);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_218,"case",&local_50a);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"for",&local_50b);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"do",&local_50c);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"while",&local_50d);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"goto",&local_50e);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"continue",&local_50f);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"break",&local_510);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"default",&local_511);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"sizeof",&local_512);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"return",&local_513);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"bool",&local_514);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"cout",&local_515);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"use",&local_516);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"func",&local_517);
  local_4e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"string",&local_518);
  __range1._7_1_ = 0;
  local_38 = &local_4d8;
  local_30 = 0x25;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&__range1 + 6));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&__range1 + 6));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&__range1 + 6));
  local_7c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_7c0 = local_7c0 + -1;
    std::__cxx11::string::~string((string *)local_7c0);
  } while (local_7c0 != &local_4d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_517);
  std::allocator<char>::~allocator((allocator<char> *)&local_516);
  std::allocator<char>::~allocator((allocator<char> *)&local_515);
  std::allocator<char>::~allocator((allocator<char> *)&local_514);
  std::allocator<char>::~allocator((allocator<char> *)&local_513);
  std::allocator<char>::~allocator((allocator<char> *)&local_512);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::allocator<char>::~allocator((allocator<char> *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_50f);
  std::allocator<char>::~allocator((allocator<char> *)&local_50e);
  std::allocator<char>::~allocator((allocator<char> *)&local_50d);
  std::allocator<char>::~allocator((allocator<char> *)&local_50c);
  std::allocator<char>::~allocator((allocator<char> *)&local_50b);
  std::allocator<char>::~allocator((allocator<char> *)&local_50a);
  std::allocator<char>::~allocator((allocator<char> *)&local_509);
  std::allocator<char>::~allocator((allocator<char> *)&local_508);
  std::allocator<char>::~allocator((allocator<char> *)&local_507);
  std::allocator<char>::~allocator((allocator<char> *)&local_506);
  std::allocator<char>::~allocator((allocator<char> *)&local_505);
  std::allocator<char>::~allocator((allocator<char> *)&local_504);
  std::allocator<char>::~allocator((allocator<char> *)&local_503);
  std::allocator<char>::~allocator((allocator<char> *)&local_502);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  std::allocator<char>::~allocator((allocator<char> *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_4ff);
  std::allocator<char>::~allocator((allocator<char> *)&local_4fe);
  std::allocator<char>::~allocator((allocator<char> *)&local_4fd);
  std::allocator<char>::~allocator((allocator<char> *)&local_4fc);
  std::allocator<char>::~allocator((allocator<char> *)&local_4fb);
  std::allocator<char>::~allocator((allocator<char> *)&local_4fa);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f7);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f6);
  std::allocator<char>::~allocator((allocator<char> *)local_4f5);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_28);
  c.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&c.field_2 + 8));
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_558,(string *)pbVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this,(value_type *)local_558);
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(this->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,(key_type *)local_558);
    *pmVar4 = (mapped_type)sVar3;
    std::__cxx11::string::~string((string *)local_558);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

KeyWordTable::KeyWordTable() {
    vector<string> keyWord = { "auto" , "short" , "int" , "long" , "real" ,
                               "double" , "char" , "struct" , "union" , "enum" , "typedef" ,
                               "const" , "unsigned" , "signed" , "extern" , "register" , "static" ,
                               "volatile" , "void" , "if" , "else" , "switch" , "case" , "for" ,
                               "do" , "while" , "goto" , "continue" , "break" , "default" ,
                               "sizeof" , "return" , "bool" , "cout", "use", "func", "string"};
    for(auto c : keyWord) {
        tokenTable.push_back(c);
        index[c] = static_cast<int>(tokenTable.size());
    }
}